

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O2

void If_ManComputeSwitching(If_Man_t *pIfMan)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  uint Lit;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Gia_Man_t *pGia;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  abctime aVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  char *__assertion;
  
  aVar6 = Abc_Clock();
  if (pIfMan->vSwitching == (Vec_Int_t *)0x0) {
    pGia = Gia_ManStart(pIfMan->vObjs->nSize);
    pVVar7 = Vec_IntAlloc(pIfMan->vObjs->nSize);
    Vec_IntPush(pVVar7,1);
    for (iVar14 = 0; iVar14 < pIfMan->vCis->nSize; iVar14 = iVar14 + 1) {
      Vec_PtrEntry(pIfMan->vCis,iVar14);
      pGVar8 = Gia_ManAppendObj(pGia);
      uVar11 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGia->vCis->nSize & 0x1fffffff) << 0x20;
      pVVar1 = pGia->vCis;
      iVar2 = Gia_ObjId(pGia,pGVar8);
      Vec_IntPush(pVVar1,iVar2);
      iVar2 = Gia_ObjId(pGia,pGVar8);
      Vec_IntPush(pVVar7,iVar2 * 2);
    }
    for (iVar14 = 0; iVar14 < pIfMan->vObjs->nSize; iVar14 = iVar14 + 1) {
      puVar9 = (uint *)Vec_PtrEntry(pIfMan->vObjs,iVar14);
      if ((*puVar9 & 0xf) == 4) {
        iVar2 = Vec_IntEntry(pVVar7,*(int *)(*(long *)(puVar9 + 6) + 4));
        uVar3 = Abc_LitNotCond(iVar2,*puVar9 >> 4 & 1);
        iVar2 = Vec_IntEntry(pVVar7,*(int *)(*(long *)(puVar9 + 8) + 4));
        Lit = Abc_LitNotCond(iVar2,*puVar9 >> 5 & 1);
        pGVar8 = Gia_ManAppendObj(pGia);
        iVar2 = Abc_Lit2Var(uVar3);
        if (pGia->nObjs <= iVar2) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        iVar2 = Abc_Lit2Var(Lit);
        if (pGia->nObjs <= iVar2) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        if (pGia->fGiaSimple == 0) {
          iVar2 = Abc_Lit2Var(uVar3);
          iVar4 = Abc_Lit2Var(Lit);
          if (iVar2 == iVar4) {
            __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
        }
        iVar2 = Gia_ObjId(pGia,pGVar8);
        iVar4 = Abc_Lit2Var(uVar3);
        uVar11 = (ulong)(iVar2 - iVar4 & 0x1fffffff);
        if (uVar3 < Lit) {
          *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xffffffffe0000000 | uVar11;
          iVar2 = Abc_LitIsCompl(uVar3);
          *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
          iVar2 = Gia_ObjId(pGia,pGVar8);
          iVar4 = Abc_Lit2Var(Lit);
          *(ulong *)pGVar8 =
               *(ulong *)pGVar8 & 0xe0000000ffffffff | (ulong)(iVar2 - iVar4 & 0x1fffffff) << 0x20;
          uVar3 = Abc_LitIsCompl(Lit);
          uVar10 = (ulong)uVar3 << 0x3d;
          uVar11 = *(ulong *)pGVar8;
          uVar13 = 0xdfffffffffffffff;
        }
        else {
          *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xe0000000ffffffff | uVar11 << 0x20;
          uVar3 = Abc_LitIsCompl(uVar3);
          *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xdfffffffffffffff | (ulong)uVar3 << 0x3d;
          iVar2 = Gia_ObjId(pGia,pGVar8);
          iVar4 = Abc_Lit2Var(Lit);
          *(ulong *)pGVar8 =
               *(ulong *)pGVar8 & 0xffffffffe0000000 | (ulong)(iVar2 - iVar4 & 0x1fffffff);
          iVar2 = Abc_LitIsCompl(Lit);
          uVar10 = (ulong)(uint)(iVar2 << 0x1d);
          uVar11 = *(ulong *)pGVar8;
          uVar13 = 0xffffffffdfffffff;
        }
        *(ulong *)pGVar8 = uVar11 & uVar13 | uVar10;
        if (pGia->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(pGia,pGVar8 + -(uVar11 & uVar13 & 0x1fffffff),pGVar8);
          Gia_ObjAddFanout(pGia,pGVar8 + -((ulong)*(uint *)&pGVar8->field_0x4 & 0x1fffffff),pGVar8);
        }
        if (pGia->fSweeper != 0) {
          uVar10 = *(ulong *)pGVar8 & 0x1fffffff;
          uVar11 = *(ulong *)pGVar8 >> 0x20 & 0x1fffffff;
          uVar13 = 0x4000000000000000;
          if (((uint)*(ulong *)(pGVar8 + -uVar10) >> 0x1e & 1) == 0) {
            uVar13 = 0x40000000;
          }
          *(ulong *)(pGVar8 + -uVar10) = uVar13 | *(ulong *)(pGVar8 + -uVar10);
          uVar13 = *(ulong *)(pGVar8 + -uVar11);
          uVar15 = 0x4000000000000000;
          if (((uint)uVar13 >> 0x1e & 1) == 0) {
            uVar15 = 0x40000000;
          }
          *(ulong *)(pGVar8 + -uVar11) = uVar15 | uVar13;
          uVar11 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 =
               uVar11 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar11 >> 0x3d) ^ (uint)(uVar13 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar8 + -uVar10) >> 0x3f) ^
                      (uint)(uVar11 >> 0x1d) & 7)) << 0x3f;
        }
        if (pGia->fBuiltInSim != 0) {
          uVar11 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 =
               uVar11 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar11 >> 0x3d) ^
                       (uint)((ulong)*(undefined8 *)(pGVar8 + -(uVar11 >> 0x20 & 0x1fffffff)) >>
                             0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar8 + -(uVar11 & 0x1fffffff)) >> 0x3f) ^
                      (uint)(uVar11 >> 0x1d) & 7)) << 0x3f;
          iVar2 = Gia_ObjId(pGia,pGVar8);
          Gia_ManBuiltInSimPerform(pGia,iVar2);
        }
        if (pGia->vSuppWords != (Vec_Wrd_t *)0x0) {
          Gia_ManQuantSetSuppAnd(pGia,pGVar8);
        }
        iVar2 = Gia_ObjId(pGia,pGVar8);
        Vec_IntPush(pVVar7,iVar2 * 2);
      }
    }
    for (iVar14 = 0; iVar14 < pIfMan->vCos->nSize; iVar14 = iVar14 + 1) {
      puVar9 = (uint *)Vec_PtrEntry(pIfMan->vCos,iVar14);
      iVar2 = Vec_IntEntry(pVVar7,*(int *)(*(long *)(puVar9 + 6) + 4));
      iVar2 = Abc_LitNotCond(iVar2,*puVar9 >> 4 & 1);
      iVar4 = Abc_Lit2Var(iVar2);
      if (pGia->nObjs <= iVar4) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      iVar4 = Abc_Lit2Var(iVar2);
      pGVar8 = Gia_ManObj(pGia,iVar4);
      if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && (int)*(uint *)pGVar8 < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar8 = Gia_ManAppendObj(pGia);
      *(ulong *)pGVar8 = *(ulong *)pGVar8 | 0x80000000;
      iVar4 = Gia_ObjId(pGia,pGVar8);
      iVar5 = Abc_Lit2Var(iVar2);
      *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xffffffffe0000000 | (ulong)(iVar4 - iVar5 & 0x1fffffff)
      ;
      iVar2 = Abc_LitIsCompl(iVar2);
      uVar11 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar11 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
      *(ulong *)pGVar8 =
           uVar11 & 0xe0000000dfffffff | (ulong)(uint)(iVar2 << 0x1d) |
           (ulong)(pGia->vCos->nSize & 0x1fffffff) << 0x20;
      pVVar1 = pGia->vCos;
      iVar2 = Gia_ObjId(pGia,pGVar8);
      Vec_IntPush(pVVar1,iVar2);
      if (pGia->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(pGia,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff),pGVar8);
      }
      iVar2 = Gia_ObjId(pGia,pGVar8);
      Vec_IntPush(pVVar7,iVar2 * 2);
    }
    if (pVVar7->nSize == pIfMan->vObjs->nSize) {
      Vec_IntFree(pVVar7);
      pVVar7 = Gia_ManComputeSwitchProbs(pGia,0x30,0x10,0);
      pIfMan->vSwitching = pVVar7;
      Gia_ManStop(pGia);
      iVar14 = (int)pGia;
      if (pIfMan->pPars->fVerbose != 0) {
        aVar12 = Abc_Clock();
        Abc_Print(iVar14,"%s =","Computing switching activity");
        Abc_Print(iVar14,"%9.2f sec\n",(double)(aVar12 - aVar6) / 1000000.0);
        return;
      }
      return;
    }
    __assertion = "Vec_IntSize(vCopy) == If_ManObjNum(pIfMan)";
    uVar3 = 0x57;
  }
  else {
    __assertion = "pIfMan->vSwitching == NULL";
    uVar3 = 0x42;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                ,uVar3,"void If_ManComputeSwitching(If_Man_t *)");
}

Assistant:

void If_ManComputeSwitching( If_Man_t * pIfMan )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vCopy;
    If_Obj_t * pIfObj;
    int i;
    assert( pIfMan->vSwitching == NULL );
    // create the new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    vCopy = Vec_IntAlloc( If_ManObjNum(pIfMan) );
    // constant and inputs
    Vec_IntPush( vCopy, 1 );
    If_ManForEachCi( pIfMan, pIfObj, i )
        Vec_IntPush( vCopy, Gia_ManAppendCi(pNew) );
    // internal nodes
    If_ManForEachNode( pIfMan, pIfObj, i )
    {
        int iLit0 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin0(pIfObj)->Id), If_ObjFaninC0(pIfObj) );
        int iLit1 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin1(pIfObj)->Id), If_ObjFaninC1(pIfObj) );
        Vec_IntPush( vCopy, Gia_ManAppendAnd(pNew, iLit0, iLit1) );
    }
    // outputs
    If_ManForEachCo( pIfMan, pIfObj, i )
    {
        int iLit0 = Abc_LitNotCond( Vec_IntEntry(vCopy, If_ObjFanin0(pIfObj)->Id), If_ObjFaninC0(pIfObj) );
        Vec_IntPush( vCopy, Gia_ManAppendCo(pNew, iLit0) );
    }
    assert( Vec_IntSize(vCopy) == If_ManObjNum(pIfMan) );
    Vec_IntFree( vCopy );
    // compute switching activity
    pIfMan->vSwitching = Gia_ManComputeSwitchProbs( pNew, 48, 16, 0 );
    Gia_ManStop( pNew );
    if ( pIfMan->pPars->fVerbose )
        Abc_PrintTime( 1, "Computing switching activity", Abc_Clock() - clk );
}